

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator::GenerateMembers
          (RepeatedImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  Context *this_00;
  bool bVar1;
  FileDescriptor *pFVar2;
  FieldOptions *this_01;
  Descriptor *descriptor;
  Printer *printer_local;
  RepeatedImmutableEnumFieldLiteGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "private com.google.protobuf.Internal.IntList $name$_;\nprivate static final com.google.protobuf.Internal.ListAdapter.Converter<\n    java.lang.Integer, $type$> $name$_converter_ =\n        new com.google.protobuf.Internal.ListAdapter.Converter<\n            java.lang.Integer, $type$>() {\n          public $type$ convert(java.lang.Integer from) {\n            $type$ result = $type$.forNumber(from);\n            return result == null ? $unknown$ : result;\n          }\n        };\n"
                    );
  PrintExtraFieldInfo(&this->variables_,printer);
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$public java.util.List<$type$> get$capitalized_name$List() {\n  return new com.google.protobuf.Internal.ListAdapter<\n      java.lang.Integer, $type$>($name$_, $name$_converter_);\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$public int get$capitalized_name$Count() {\n  return $name$_.size();\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$public $type$ get$capitalized_name$(int index) {\n  return $name$_converter_.convert($name$_.getInt(index));\n}\n"
                    );
  pFVar2 = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportUnknownEnumValue(pFVar2);
  if (bVar1) {
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$public java.util.List<java.lang.Integer>\nget$capitalized_name$ValueList() {\n  return $name$_;\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$public int get$capitalized_name$Value(int index) {\n  return $name$_.getInt(index);\n}\n"
                      );
  }
  this_01 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(this_01);
  if (bVar1) {
    this_00 = this->context_;
    descriptor = FieldDescriptor::containing_type(this->descriptor_);
    bVar1 = Context::HasGeneratedMethods(this_00,descriptor);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,"private int $name$MemoizedSerializedSize;\n");
    }
  }
  io::Printer::Print(printer,&this->variables_,
                     "private void ensure$capitalized_name$IsMutable() {\n  if (!$is_mutable$) {\n    $name$_ =\n        com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n  }\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "private void set$capitalized_name$(\n    int index, $type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  ensure$capitalized_name$IsMutable();\n  $name$_.setInt(index, value.getNumber());\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "private void add$capitalized_name$($type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  ensure$capitalized_name$IsMutable();\n  $name$_.addInt(value.getNumber());\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "private void addAll$capitalized_name$(\n    java.lang.Iterable<? extends $type$> values) {\n  ensure$capitalized_name$IsMutable();\n  for ($type$ value : values) {\n    $name$_.addInt(value.getNumber());\n  }\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "private void clear$capitalized_name$() {\n  $name$_ = emptyIntList();\n}\n");
  pFVar2 = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportUnknownEnumValue(pFVar2);
  if (bVar1) {
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "private void set$capitalized_name$Value(\n    int index, int value) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.setInt(index, value);\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "private void add$capitalized_name$Value(int value) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.addInt(value);\n}\n"
                      );
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "private void addAll$capitalized_name$Value(\n    java.lang.Iterable<java.lang.Integer> values) {\n  ensure$capitalized_name$IsMutable();\n  for (int value : values) {\n    $name$_.addInt(value);\n  }\n}\n"
                      );
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldLiteGenerator::
GenerateMembers(io::Printer* printer) const {
  printer->Print(variables_,
    "private com.google.protobuf.Internal.IntList $name$_;\n"
    "private static final com.google.protobuf.Internal.ListAdapter.Converter<\n"
    "    java.lang.Integer, $type$> $name$_converter_ =\n"
    "        new com.google.protobuf.Internal.ListAdapter.Converter<\n"
    "            java.lang.Integer, $type$>() {\n"
    "          public $type$ convert(java.lang.Integer from) {\n"
    "            $type$ result = $type$.forNumber(from);\n"
    "            return result == null ? $unknown$ : result;\n"
    "          }\n"
    "        };\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.util.List<$type$> get$capitalized_name$List() {\n"
    "  return new com.google.protobuf.Internal.ListAdapter<\n"
    "      java.lang.Integer, $type$>($name$_, $name$_converter_);\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public int get$capitalized_name$Count() {\n"
    "  return $name$_.size();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$(int index) {\n"
    "  return $name$_converter_.convert($name$_.getInt(index));\n"
    "}\n");
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public java.util.List<java.lang.Integer>\n"
      "get$capitalized_name$ValueList() {\n"
      "  return $name$_;\n"
      "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public int get$capitalized_name$Value(int index) {\n"
      "  return $name$_.getInt(index);\n"
      "}\n");
  }

  if (descriptor_->options().packed() &&
      context_->HasGeneratedMethods(descriptor_->containing_type())) {
    printer->Print(variables_,
      "private int $name$MemoizedSerializedSize;\n");
  }

  // Generate private setters for the builder to proxy into.
  printer->Print(variables_,
    "private void ensure$capitalized_name$IsMutable() {\n"
    "  if (!$is_mutable$) {\n"
    "    $name$_ =\n"
    "        com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n"
    "  }\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$(\n"
    "    int index, $type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.setInt(index, value.getNumber());\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void add$capitalized_name$($type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.addInt(value.getNumber());\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void addAll$capitalized_name$(\n"
    "    java.lang.Iterable<? extends $type$> values) {\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  for ($type$ value : values) {\n"
    "    $name$_.addInt(value.getNumber());\n"
    "  }\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void clear$capitalized_name$() {\n"
    "  $name$_ = emptyIntList();\n"
    "}\n");

  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "private void set$capitalized_name$Value(\n"
      "    int index, int value) {\n"
      "  ensure$capitalized_name$IsMutable();\n"
      "  $name$_.setInt(index, value);\n"
      "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "private void add$capitalized_name$Value(int value) {\n"
      "  ensure$capitalized_name$IsMutable();\n"
      "  $name$_.addInt(value);\n"
      "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "private void addAll$capitalized_name$Value(\n"
      "    java.lang.Iterable<java.lang.Integer> values) {\n"
      "  ensure$capitalized_name$IsMutable();\n"
      "  for (int value : values) {\n"
      "    $name$_.addInt(value);\n"
      "  }\n"
      "}\n");
  }
}